

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeGenerator.cpp
# Opt level: O0

void __thiscall ByteCodeGenerator::CheckDeferParseHasMaybeEscapedNestedFunc(ByteCodeGenerator *this)

{
  code *pcVar1;
  SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount> *pSVar2;
  bool bVar3;
  ScopeType SVar4;
  uint sourceContextId;
  LocalFunctionId functionId;
  int iVar5;
  undefined4 *puVar6;
  Type_conflict pSVar7;
  Type *ppFVar8;
  ParseableFunctionInfo *pPVar9;
  FunctionBody *this_00;
  FuncInfo *pFVar10;
  FunctionInfo *parentFunctionInfo_00;
  Scope *pSVar11;
  undefined4 extraout_var;
  char16 *pcVar12;
  Scope *local_140;
  Scope *local_138;
  OutOfMemoryException anon_var_0;
  wchar local_f8 [4];
  char16 debugStringBuffer [42];
  FunctionBody *functionBody;
  bool didStackNestedFunc;
  ParseableFunctionInfo *parseableFunctionInfo;
  FuncInfo *funcInfo;
  ParseableFunctionInfo *parentFunctionInfo;
  FuncInfo *parentFunc;
  Scope *enclosingScope;
  FunctionBody *rootFuncBody;
  FuncInfo *top;
  undefined1 auStack_50 [7];
  bool succeed;
  Iterator i;
  ByteCodeGenerator *this_local;
  
  if (this->parentScopeInfo != (ScopeInfo *)0x0) {
    i.current = (NodeBase *)this;
    if ((this->funcInfoStack == (SList<FuncInfo_*,_Memory::ArenaAllocator,_RealCount> *)0x0) ||
       (bVar3 = SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>::Empty
                          (&this->funcInfoStack->
                            super_SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>), bVar3))
    {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                         ,0x82f,"(this->funcInfoStack && !this->funcInfoStack->Empty())",
                         "this->funcInfoStack && !this->funcInfoStack->Empty()");
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
    }
    SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Iterator
              ((Iterator *)auStack_50,
               &this->funcInfoStack->super_SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>)
    ;
    if (i.list == (SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                         ,0x76,"(current != nullptr)","current != nullptr");
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
    }
    pSVar2 = _auStack_50;
    pSVar7 = SListNodeBase<Memory::ArenaAllocator>::Next
                       (&(i.list)->super_SListNodeBase<Memory::ArenaAllocator>);
    bVar3 = SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>::IsHead(pSVar2,pSVar7);
    if (bVar3) {
      i.list = (SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount> *)0x0;
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                         ,0x834,"(succeed)","succeed");
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
    }
    else {
      i.list = (SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount> *)
               SListNodeBase<Memory::ArenaAllocator>::Next
                         (&(i.list)->super_SListNodeBase<Memory::ArenaAllocator>);
    }
    ppFVar8 = SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                        ((Iterator *)auStack_50);
    bVar3 = FuncInfo::IsGlobalFunction(*ppFVar8);
    if (!bVar3) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                         ,0x835,"(i.Data()->IsGlobalFunction())","i.Data()->IsGlobalFunction()");
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
    }
    ppFVar8 = SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                        ((Iterator *)auStack_50);
    bVar3 = FuncInfo::IsRestored(*ppFVar8);
    if (bVar3) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                         ,0x836,"(!i.Data()->IsRestored())","!i.Data()->IsRestored()");
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
    }
    if (i.list == (SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                         ,0x76,"(current != nullptr)","current != nullptr");
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
    }
    pSVar2 = _auStack_50;
    pSVar7 = SListNodeBase<Memory::ArenaAllocator>::Next
                       (&(i.list)->super_SListNodeBase<Memory::ArenaAllocator>);
    bVar3 = SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>::IsHead(pSVar2,pSVar7);
    if (bVar3) {
      i.list = (SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount> *)0x0;
    }
    else {
      i.list = (SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount> *)
               SListNodeBase<Memory::ArenaAllocator>::Next
                         (&(i.list)->super_SListNodeBase<Memory::ArenaAllocator>);
    }
    ppFVar8 = SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                        ((Iterator *)auStack_50);
    pFVar10 = *ppFVar8;
    bVar3 = FuncInfo::IsGlobalFunction(pFVar10);
    if (bVar3) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                         ,0x83a,"(!top->IsGlobalFunction())","!top->IsGlobalFunction()");
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
    }
    bVar3 = FuncInfo::IsRestored(pFVar10);
    if (!bVar3) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                         ,0x83b,"(top->IsRestored())","top->IsRestored()");
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
    }
    pPVar9 = GetRootFunc(this);
    this_00 = Js::FunctionProxy::GetFunctionBody(&pPVar9->super_FunctionProxy);
    bVar3 = Js::ParseableFunctionInfo::DoStackNestedFunc(&this_00->super_ParseableFunctionInfo);
    if (bVar3) {
      pSVar11 = FuncInfo::GetParamScope(pFVar10);
      if (pSVar11 == (Scope *)0x0) {
        pSVar11 = FuncInfo::GetBodyScope(pFVar10);
        if (pSVar11 == (Scope *)0x0) {
          local_140 = FuncInfo::GetFuncExprScope(pFVar10);
        }
        else {
          local_140 = FuncInfo::GetBodyScope(pFVar10);
        }
        local_138 = local_140;
      }
      else {
        local_138 = FuncInfo::GetParamScope(pFVar10);
      }
      pFVar10 = Scope::GetEnclosingFunc(local_138);
      bVar3 = FuncInfo::IsGlobalFunction(pFVar10);
      if (!bVar3) {
        if ((FunctionBody *)pFVar10->byteCodeFunction == this_00) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar6 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                             ,0x84a,"(parentFunc->byteCodeFunction != rootFuncBody)",
                             "parentFunc->byteCodeFunction != rootFuncBody");
          if (!bVar3) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar6 = 0;
        }
        pPVar9 = pFVar10->byteCodeFunction;
        bVar3 = Js::ParseableFunctionInfo::DoStackNestedFunc(pPVar9);
        if (bVar3) {
          parentFunctionInfo_00 = Js::FunctionProxy::GetFunctionInfo(&pPVar9->super_FunctionProxy);
          Js::FunctionBody::SetStackNestedFuncParent(this_00,parentFunctionInfo_00);
        }
      }
    }
    else {
      FuncInfo::SetHasMaybeEscapedNestedFunc(pFVar10,L"DeferredChild");
    }
    while( true ) {
      ppFVar8 = SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                          ((Iterator *)auStack_50);
      pFVar10 = *ppFVar8;
      bVar3 = FuncInfo::IsRestored(pFVar10);
      if (!bVar3) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                           ,0x856,"(funcInfo->IsRestored())","funcInfo->IsRestored()");
        if (!bVar3) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 0;
      }
      pPVar9 = pFVar10->byteCodeFunction;
      if (pPVar9 == (ParseableFunctionInfo *)0x0) break;
      bVar3 = Js::ParseableFunctionInfo::DoStackNestedFunc(pPVar9);
      if (!bVar3) {
        return;
      }
      bVar3 = Js::FunctionProxy::IsFunctionBody(&pPVar9->super_FunctionProxy);
      if (bVar3) {
        register0x00000000 = FuncInfo::GetParsedFunctionBody(pFVar10);
        bVar3 = FuncInfo::HasMaybeEscapedNestedFunc(pFVar10);
        if (bVar3) {
          sourceContextId =
               Js::FunctionProxy::GetSourceContextId((FunctionProxy *)this->pCurrentFunction);
          functionId = Js::FunctionProxy::GetLocalFunctionId
                                 ((FunctionProxy *)this->pCurrentFunction);
          bVar3 = Js::Phases::IsEnabled
                            ((Phases *)&DAT_01ec73f0,StackFuncPhase,sourceContextId,functionId);
          if (bVar3) {
            iVar5 = (*(stack0xffffffffffffff60->super_ParseableFunctionInfo).super_FunctionProxy.
                      super_FinalizableObject.super_IRecyclerVisitedObject.
                      _vptr_IRecyclerVisitedObject[7])();
            pcVar12 = Js::FunctionProxy::GetDebugNumberSet
                                ((FunctionProxy *)stack0xffffffffffffff60,(wchar (*) [42])local_f8);
            Output::Print(L"DeferParse: box and disable stack function: %s (function %s)\n",
                          CONCAT44(extraout_var,iVar5),pcVar12);
            Output::Flush();
          }
          Js::StackScriptFunction::Box(stack0xffffffffffffff60,this->functionRef);
          return;
        }
      }
      if (i.list == (SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                           ,0x76,"(current != nullptr)","current != nullptr");
        if (!bVar3) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 0;
      }
      pSVar2 = _auStack_50;
      pSVar7 = SListNodeBase<Memory::ArenaAllocator>::Next
                         (&(i.list)->super_SListNodeBase<Memory::ArenaAllocator>);
      bVar3 = SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>::IsHead(pSVar2,pSVar7);
      if (bVar3) {
        return;
      }
      i.list = (SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount> *)
               SListNodeBase<Memory::ArenaAllocator>::Next
                         (&(i.list)->super_SListNodeBase<Memory::ArenaAllocator>);
    }
    pSVar11 = FuncInfo::GetBodyScope(pFVar10);
    if (pSVar11 != (Scope *)0x0) {
      pSVar11 = FuncInfo::GetBodyScope(pFVar10);
      SVar4 = Scope::GetScopeType(pSVar11);
      if (SVar4 == ScopeType_Global) {
        return;
      }
    }
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                       ,0x85a,
                       "(funcInfo->GetBodyScope() && funcInfo->GetBodyScope()->GetScopeType() == ScopeType_Global)"
                       ,
                       "funcInfo->GetBodyScope() && funcInfo->GetBodyScope()->GetScopeType() == ScopeType_Global"
                      );
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  return;
}

Assistant:

void ByteCodeGenerator::CheckDeferParseHasMaybeEscapedNestedFunc()
{
    if (!this->parentScopeInfo)
    {
        return;
    }

    Assert(this->funcInfoStack && !this->funcInfoStack->Empty());

    // Box the stack nested function if we detected new may be escaped use function.
    SList<FuncInfo *>::Iterator i(this->funcInfoStack);
    bool succeed = i.Next();
    Assert(succeed);
    Assert(i.Data()->IsGlobalFunction()); // We always leave a glo on type when defer parsing.
    Assert(!i.Data()->IsRestored());
    succeed = i.Next();
    FuncInfo * top = i.Data();

    Assert(!top->IsGlobalFunction());
    Assert(top->IsRestored());
    Js::FunctionBody * rootFuncBody = this->GetRootFunc()->GetFunctionBody();
    if (!rootFuncBody->DoStackNestedFunc())
    {
        top->SetHasMaybeEscapedNestedFunc(DebugOnly(_u("DeferredChild")));
    }
    else
    {
        // We have to wait until it is parsed before we populate the stack nested func parent.
        Scope * enclosingScope = top->GetParamScope() ? top->GetParamScope() :
                                 top->GetBodyScope() ? top->GetBodyScope() :
                                 top->GetFuncExprScope();
        FuncInfo * parentFunc = enclosingScope->GetEnclosingFunc();
        if (!parentFunc->IsGlobalFunction())
        {
            Assert(parentFunc->byteCodeFunction != rootFuncBody);
            Js::ParseableFunctionInfo * parentFunctionInfo = parentFunc->byteCodeFunction;
            if (parentFunctionInfo->DoStackNestedFunc())
            {
                rootFuncBody->SetStackNestedFuncParent(parentFunctionInfo->GetFunctionInfo());
            }
        }
    }

    do
    {
        FuncInfo * funcInfo = i.Data();
        Assert(funcInfo->IsRestored());
        Js::ParseableFunctionInfo * parseableFunctionInfo = funcInfo->byteCodeFunction;
        if (parseableFunctionInfo == nullptr)
        {
            Assert(funcInfo->GetBodyScope() && funcInfo->GetBodyScope()->GetScopeType() == ScopeType_Global);
            return;
        }
        bool didStackNestedFunc = parseableFunctionInfo->DoStackNestedFunc();
        if (!didStackNestedFunc)
        {
            return;
        }
        if (!parseableFunctionInfo->IsFunctionBody())
        {
            continue;
        }
        Js::FunctionBody * functionBody = funcInfo->GetParsedFunctionBody();
        if (funcInfo->HasMaybeEscapedNestedFunc())
        {
            // This should box the rest of the parent functions.
            if (PHASE_TESTTRACE(Js::StackFuncPhase, this->pCurrentFunction))
            {
                char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];

                Output::Print(_u("DeferParse: box and disable stack function: %s (function %s)\n"),
                    functionBody->GetDisplayName(), functionBody->GetDebugNumberSet(debugStringBuffer));
                Output::Flush();
            }

            // During the box workflow we reset all the parents of all nested functions and up. If a fault occurs when the stack function
            // is created this will cause further issues when trying to use the function object again. So failing faster seems to make more sense.
            try
            {
                Js::StackScriptFunction::Box(functionBody, functionRef);
            }
            catch (Js::OutOfMemoryException)
            {
                FailedToBox_OOM_unrecoverable_error((ULONG_PTR)functionBody);
            }

            return;
        }
    }
    while (i.Next());
}